

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

void __thiscall t_rs_generator::generate_typedef(t_rs_generator *this,t_typedef *ttypedef)

{
  t_type *ttype;
  ostream *poVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  char *this_00;
  string actual_type;
  string local_50;
  string local_30;
  
  ttype = t_typedef::get_type(ttypedef);
  to_rust_type_abi_cxx11_(&local_30,this,ttype);
  poVar2 = &this->f_gen_;
  this_00 = "pub type ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"pub type ",9);
  rust_safe_name(&local_50,(t_rs_generator *)this_00,&ttypedef->symbolic_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::generate_typedef(t_typedef* ttypedef) {
  std::string actual_type = to_rust_type(ttypedef->get_type());
  f_gen_ << "pub type " << rust_safe_name(ttypedef->get_symbolic()) << " = " << actual_type << ";" << endl;
  f_gen_ << endl;
}